

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O0

void __thiscall
t_lua_generator::generate_process_function
          (t_lua_generator *this,ostream *out,t_service *tservice,t_function *tfunction)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  string *psVar3;
  ostream *poVar4;
  members_type *this_00;
  size_type sVar5;
  t_struct *ptVar6;
  reference pptVar7;
  t_type *ptVar8;
  undefined4 extraout_var_00;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_248
  ;
  t_field **local_240;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_238
  ;
  const_iterator x_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *xf;
  string local_208;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  string local_1a0;
  t_struct *local_180;
  t_struct *args;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8 [8];
  string fn_name;
  string resultname;
  undefined1 local_68 [8];
  string argsname;
  string classname;
  t_function *tfunction_local;
  t_service *tservice_local;
  ostream *out_local;
  t_lua_generator *this_local;
  
  iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&argsname.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar2),"Processor");
  psVar3 = t_function::get_name_abi_cxx11_(tfunction);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 psVar3,"_args");
  psVar3 = t_function::get_name_abi_cxx11_(tfunction);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&fn_name.field_2 + 8),psVar3,"_result");
  psVar3 = t_function::get_name_abi_cxx11_(tfunction);
  std::__cxx11::string::string(local_b8,(string *)psVar3);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"function ");
  poVar4 = std::operator<<(poVar4,(string *)(argsname.field_2._M_local_buf + 8));
  poVar4 = std::operator<<(poVar4,":process_");
  poVar4 = std::operator<<(poVar4,local_b8);
  poVar4 = std::operator<<(poVar4,"(seqid, iprot, oprot, server_ctx)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_d8);
  poVar4 = std::operator<<(poVar4,"local args = ");
  poVar4 = std::operator<<(poVar4,(string *)local_68);
  poVar4 = std::operator<<(poVar4,":new{}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_f8);
  poVar4 = std::operator<<(poVar4,"local reply_type = TMessageType.REPLY");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_118);
  poVar4 = std::operator<<(poVar4,"args:read(iprot)");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_138);
  poVar4 = std::operator<<(poVar4,"iprot:readMessageEnd()");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  bVar1 = t_function::is_oneway(tfunction);
  if (!bVar1) {
    t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_158);
    poVar4 = std::operator<<(poVar4,"local result = ");
    poVar4 = std::operator<<(poVar4,(string *)(fn_name.field_2._M_local_buf + 8));
    poVar4 = std::operator<<(poVar4,":new{}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_158);
  }
  t_generator::indent_abi_cxx11_((string *)&args,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&args);
  poVar4 = std::operator<<(poVar4,"local status, res = pcall(self.handler.");
  poVar4 = std::operator<<(poVar4,local_b8);
  std::operator<<(poVar4,", self.handler");
  std::__cxx11::string::~string((string *)&args);
  local_180 = t_function::get_arglist(tfunction);
  this_00 = t_struct::get_members(local_180);
  sVar5 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size(this_00);
  if (sVar5 != 0) {
    poVar4 = std::operator<<(out,", ");
    ptVar6 = local_180;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c0,"args.",&local_1c1);
    argument_list(&local_1a0,this,ptVar6,&local_1c0);
    std::operator<<(poVar4,(string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  }
  poVar4 = std::operator<<(out,")");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  bVar1 = t_function::is_oneway(tfunction);
  if (!bVar1) {
    t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_1e8);
    poVar4 = std::operator<<(poVar4,"if not status then");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_208);
    poVar4 = std::operator<<(poVar4,"  reply_type = TMessageType.EXCEPTION");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)&xf,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&xf);
    poVar4 = std::operator<<(poVar4,"  result = TApplicationException:new{message = res}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&xf);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    ptVar6 = t_function::get_xceptions(tfunction);
    x_iter._M_current = (t_field **)t_struct::get_members(ptVar6);
    sVar5 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size
                      ((vector<t_field_*,_std::allocator<t_field_*>_> *)x_iter._M_current);
    if (sVar5 != 0) {
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      __normal_iterator(&local_238);
      local_240 = (t_field **)
                  std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(x_iter._M_current);
      local_238._M_current = local_240;
      while( true ) {
        local_248._M_current =
             (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(x_iter._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_238,&local_248);
        if (!bVar1) break;
        t_generator::indent_abi_cxx11_(&local_268,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_268);
        poVar4 = std::operator<<(poVar4,"elseif ttype(res) == \'");
        pptVar7 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_238);
        ptVar8 = t_field::get_type(*pptVar7);
        iVar2 = (*(ptVar8->super_t_doc)._vptr_t_doc[3])();
        poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar2));
        poVar4 = std::operator<<(poVar4,"\' then");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_288,(t_generator *)this);
        poVar4 = std::operator<<(poVar4,(string *)&local_288);
        poVar4 = std::operator<<(poVar4,"  result.");
        pptVar7 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_238);
        psVar3 = t_field::get_name_abi_cxx11_(*pptVar7);
        poVar4 = std::operator<<(poVar4,(string *)psVar3);
        poVar4 = std::operator<<(poVar4," = res");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&local_268);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_238);
      }
    }
    t_generator::indent_abi_cxx11_(&local_2a8,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_2a8);
    poVar4 = std::operator<<(poVar4,"else");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_2c8,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_2c8);
    poVar4 = std::operator<<(poVar4,"  result.success = res");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_2e8,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_2e8);
    poVar4 = std::operator<<(poVar4,"end");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_308,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_308);
    poVar4 = std::operator<<(poVar4,"oprot:writeMessageBegin(\'");
    poVar4 = std::operator<<(poVar4,local_b8);
    poVar4 = std::operator<<(poVar4,"\', reply_type, ");
    poVar4 = std::operator<<(poVar4,"seqid)");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_328,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_328);
    poVar4 = std::operator<<(poVar4,"result:write(oprot)");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_348,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_348);
    poVar4 = std::operator<<(poVar4,"oprot:writeMessageEnd()");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_368,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_368);
    poVar4 = std::operator<<(poVar4,"oprot.trans:flush()");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  t_generator::indent_abi_cxx11_(&local_388,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_388);
  poVar4 = std::operator<<(poVar4,"return status, res");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_388);
  t_generator::indent_down((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"end");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)(fn_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(argsname.field_2._M_local_buf + 8));
  return;
}

Assistant:

void t_lua_generator::generate_process_function(ostream& out,
                                                t_service* tservice,
                                                t_function* tfunction) {
  string classname = tservice->get_name() + "Processor";
  string argsname = tfunction->get_name() + "_args";
  string resultname = tfunction->get_name() + "_result";
  string fn_name = tfunction->get_name();

  indent(out) << endl << "function " << classname << ":process_" << fn_name
              << "(seqid, iprot, oprot, server_ctx)" << endl;
  indent_up();

  // Read the request
  out << indent() << "local args = " << argsname << ":new{}" << endl << indent()
      << "local reply_type = TMessageType.REPLY" << endl << indent() << "args:read(iprot)" << endl
      << indent() << "iprot:readMessageEnd()" << endl;

  if (!tfunction->is_oneway()) {
      out << indent() << "local result = " << resultname
          << ":new{}" << endl;
  }

  out <<  indent() << "local status, res = pcall(self.handler." << fn_name
      << ", self.handler";
  // Print arguments
  t_struct* args = tfunction->get_arglist();
  if (args->get_members().size() > 0) {
    out << ", " << argument_list(args, "args.");
  }
  out << ")" << endl;

  if (!tfunction->is_oneway()) {
      // Check for errors
      out << indent() << "if not status then" << endl << indent()
          << "  reply_type = TMessageType.EXCEPTION" << endl << indent()
          << "  result = TApplicationException:new{message = res}" << endl;

      // Handle custom exceptions
      const std::vector<t_field*>& xf = tfunction->get_xceptions()->get_members();
      if (xf.size() > 0) {
          vector<t_field*>::const_iterator x_iter;
          for (x_iter = xf.begin(); x_iter != xf.end(); ++x_iter) {
              out << indent() << "elseif ttype(res) == '" << (*x_iter)->get_type()->get_name() << "' then"
                  << endl << indent() << "  result." << (*x_iter)->get_name() << " = res" << endl;
          }
      }

      // Set the result and write the reply
      out << indent() << "else" << endl << indent() << "  result.success = res" << endl << indent()
          << "end" << endl << indent() << "oprot:writeMessageBegin('" << fn_name << "', reply_type, "
          << "seqid)" << endl << indent() << "result:write(oprot)" << endl << indent()
          << "oprot:writeMessageEnd()" << endl << indent() << "oprot.trans:flush()" << endl;
  }
  out << indent() << "return status, res" << endl;
  indent_down();
  indent(out) << "end" << endl;
}